

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O0

void __thiscall
de::Random::
shuffle<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
          (Random *this,
          __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
          first,__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                last)

{
  difference_type dVar1;
  reference __a;
  reference __b;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_50;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_48;
  int local_40;
  int local_3c;
  int j;
  int i;
  unsigned_short *local_30;
  int local_24;
  Random *pRStack_20;
  int numItems;
  Random *this_local;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  last_local;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  first_local;
  
  _j = last._M_current;
  local_30 = first._M_current;
  pRStack_20 = this;
  this_local = (Random *)last._M_current;
  last_local = first;
  dVar1 = std::
          distance<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                    (first,last);
  local_24 = (int)dVar1;
  local_3c = local_24;
  while (local_3c = local_3c + -1, 0 < local_3c) {
    local_40 = getInt(this,0,local_3c);
    local_48 = __gnu_cxx::
               __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator+(&last_local,(long)local_3c);
    __a = __gnu_cxx::
          __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
          ::operator*(&local_48);
    local_50 = __gnu_cxx::
               __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator+(&last_local,(long)local_40);
    __b = __gnu_cxx::
          __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
          ::operator*(&local_50);
    std::swap<unsigned_short>(__a,__b);
  }
  return;
}

Assistant:

void Random::shuffle (Iterator first, Iterator last)
{
	using std::swap;

	// Fisher-Yates suffle
	int numItems = (int)std::distance(first, last);

	for (int i = numItems-1; i >= 1; i--)
	{
		int j = getInt(0, i);
		swap(*(first + i), *(first + j));
	}
}